

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprc_inout(lys_ypr_ctx *pctx,lysc_node_action_inout *inout,ly_bool *flag)

{
  uint16_t *puVar1;
  lysc_must *plVar2;
  lysc_node *node;
  ly_stmt substmt;
  lysc_ext_instance *plVar3;
  ulong uVar4;
  long lVar5;
  lysc_ext_instance *plVar6;
  lysc_node **pplVar7;
  
  if (inout->child != (lysc_node *)0x0) {
    ypr_open((pctx->field_0).field_0.out,flag);
    uVar4 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar4 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    pplVar7 = &inout->child;
    lVar5 = 0;
    ly_print_((pctx->field_0).field_0.out,"\n%*s%s {\n",uVar4,"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    yprc_extension_instances(pctx,substmt,'\0',(inout->field_0).node.exts,(ly_bool *)0x0);
    plVar6 = (lysc_ext_instance *)0x0;
    while( true ) {
      plVar2 = inout->musts;
      if (plVar2 == (lysc_must *)0x0) {
        plVar3 = (lysc_ext_instance *)0x0;
      }
      else {
        plVar3 = plVar2[-1].exts;
      }
      if (plVar3 <= plVar6) break;
      yprc_must(pctx,(lysc_must *)((long)&plVar2->cond + lVar5),(ly_bool *)0x0);
      plVar6 = (lysc_ext_instance *)((long)&plVar6->def + 1);
      lVar5 = lVar5 + 0x38;
    }
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x1000000000) ==
        (undefined1  [24])0x0) {
      while (node = *pplVar7, node != (lysc_node *)0x0) {
        yprc_node(pctx,node);
        pplVar7 = &node->next;
      }
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,'\x01');
    return;
  }
  return;
}

Assistant:

static void
yprc_inout(struct lys_ypr_ctx *pctx, const struct lysc_node_action_inout *inout, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_node *data;

    if (!inout->child) {
        /* input/output is empty */
        return;
    }
    ypr_open(pctx->out, flag);

    ly_print_(pctx->out, "\n%*s%s {\n", INDENT, inout->name);
    LEVEL++;

    yprc_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprc_must(pctx, &inout->musts[u], NULL);
    }

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        LY_LIST_FOR(inout->child, data) {
            yprc_node(pctx, data);
        }
    }

    LEVEL--;
    ypr_close(pctx, 1);
}